

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_maddld(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 ret;
  uintptr_t o;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  ret = tcg_temp_new_i64(tcg_ctx);
  tcg_gen_mul_i64_ppc64
            (tcg_ctx,ret,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0xd & 0xf8)),
             *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 8 & 0xf8)));
  tcg_gen_add_i64(tcg_ctx,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8)),ret,
                  *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 3 & 0xf8)));
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_maddld(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);

    tcg_gen_mul_i64(tcg_ctx, t1, cpu_gpr[rA(ctx->opcode)], cpu_gpr[rB(ctx->opcode)]);
    tcg_gen_add_i64(tcg_ctx, cpu_gpr[rD(ctx->opcode)], t1, cpu_gpr[rC(ctx->opcode)]);
    tcg_temp_free_i64(tcg_ctx, t1);
}